

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O0

size_t __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::GetNrStateFactorInstantiations
          (MultiAgentDecisionProcessDiscreteFactoredStates *this,Scope *sfScope)

{
  size_type sVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *vec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  allocator_type *in_RDI;
  size_t restr_nrJSFvals;
  vector<unsigned_long,_std::allocator<unsigned_long>_> restr_nrSFvals;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrSFvals;
  Scope *in_stack_ffffffffffffffa8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb0;
  undefined8 local_8;
  
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RSI);
  if (sVar1 == 0) {
    local_8 = 0;
  }
  else {
    vec = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
          (**(code **)(*(long *)in_RDI + 0xb8))();
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RSI);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xae7af0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8,in_RDI);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xae7b10);
    IndexTools::RestrictIndividualIndicesToScope<unsigned_long>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI);
    local_8 = VectorTools::VectorProduct<unsigned_long>(vec);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI);
  }
  return local_8;
}

Assistant:

size_t MultiAgentDecisionProcessDiscreteFactoredStates::GetNrStateFactorInstantiations(const Scope& sfScope) const
{
    if(sfScope.size()>0)
    {
        const vector<size_t>& nrSFvals = GetNrValuesPerFactor();
        vector<size_t> restr_nrSFvals(sfScope.size());
        IndexTools::RestrictIndividualIndicesToScope( nrSFvals, sfScope, restr_nrSFvals );
        size_t restr_nrJSFvals = VectorTools::VectorProduct(restr_nrSFvals);
        return restr_nrJSFvals;
    }
    else
        return(0);
}